

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O0

void __thiscall
google::protobuf::internal::RepeatedPtrFieldBase::
Clear<google::protobuf::RepeatedPtrField<bloaty::CustomDataSource>::TypeHandler>
          (RepeatedPtrFieldBase *this)

{
  long lVar1;
  LogMessage *this_00;
  int iVar2;
  long in_RDI;
  int i;
  void **elements;
  int n;
  LogMessage *other;
  LogMessage *in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff94;
  int iVar3;
  LogMessage local_48;
  int local_c;
  
  local_c = *(int *)(in_RDI + 8);
  if (local_c < 0) {
    other = &local_48;
    LogMessage::LogMessage
              ((LogMessage *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
               (LogLevel_conflict)((ulong)in_RDI >> 0x20),(char *)in_stack_ffffffffffffff80,
               (int)((ulong)other >> 0x20));
    this_00 = LogMessage::operator<<(in_stack_ffffffffffffff80,(char *)other);
    LogFinisher::operator=((LogFinisher *)this_00,other);
    LogMessage::~LogMessage((LogMessage *)0x1be244);
  }
  if (0 < local_c) {
    lVar1 = *(long *)(in_RDI + 0x10);
    iVar3 = 0;
    do {
      iVar2 = iVar3 + 1;
      cast<google::protobuf::RepeatedPtrField<bloaty::CustomDataSource>::TypeHandler>
                (*(void **)(lVar1 + 8 + (long)iVar3 * 8));
      GenericTypeHandler<bloaty::CustomDataSource>::Clear((CustomDataSource *)0x1be28b);
      iVar3 = iVar2;
    } while (iVar2 < local_c);
    *(undefined4 *)(in_RDI + 8) = 0;
  }
  return;
}

Assistant:

void RepeatedPtrFieldBase::Clear() {
  const int n = current_size_;
  GOOGLE_DCHECK_GE(n, 0);
  if (n > 0) {
    void* const* elements = rep_->elements;
    int i = 0;
    do {
      TypeHandler::Clear(cast<TypeHandler>(elements[i++]));
    } while (i < n);
    current_size_ = 0;
  }
}